

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cod_node.c
# Opt level: O3

void cod_print(sm_ref node)

{
  uint uVar1;
  sm_ref psVar2;
  sm_list plVar3;
  ulong uVar4;
  sm_list plVar5;
  sm_ref psVar6;
  char *pcVar7;
  char *pcVar8;
  srcpos pos;
  
  switch(node->node_type) {
  case cod_compound_statement:
    printf("0x%p  --  compound_statement ->\n",node);
    printf("\tdecls : ");
    for (plVar3 = (node->node).compound_statement.decls; plVar3 != (sm_list)0x0;
        plVar3 = plVar3->next) {
      printf(" %p",plVar3->node);
    }
    putchar(10);
    printf("\tstatements : ");
    for (plVar3 = (node->node).compound_statement.statements; plVar3 != (sm_list)0x0;
        plVar3 = plVar3->next) {
      printf(" %p",plVar3->node);
    }
    goto LAB_00138061;
  case cod_enumerator:
    printf("0x%p  --  enumerator ->\n",node);
    plVar3 = (node->node).compound_statement.decls;
    plVar5 = (sm_list)"<NULL>";
    if (plVar3 != (sm_list)0x0) {
      plVar5 = plVar3;
    }
    printf("\tid : %s\n",plVar5);
    printf("\tconst_expression : %p\n",(node->node).compound_statement.statements);
    uVar4 = (ulong)(uint)(node->node).enumerator.enum_value;
    pcVar7 = "\tenum_value : %d\n";
    goto LAB_001381eb;
  case cod_declaration:
    printf("0x%p  --  declaration ->\n",node);
    printf("\ttype_spec : ");
    for (plVar3 = (node->node).compound_statement.decls; plVar3 != (sm_list)0x0;
        plVar3 = plVar3->next) {
      printf(" %p",plVar3->node);
    }
    putchar(10);
    printf("\tsm_complex_type : %p\n",(node->node).compound_statement.statements);
    printf("\tfreeable_complex_type : %p\n",(node->node).declaration.freeable_complex_type);
    printf("\tstatic_var : %d\n",(ulong)(node->node).assignment_expression.op);
    printf("\tconst_var : %d\n",(ulong)(uint)(node->node).declaration.const_var);
    printf("\tparam_num : %d\n",(ulong)(uint)(node->node).declaration.param_num);
    pcVar7 = (node->node).declaration.id;
    pcVar8 = "<NULL>";
    if (pcVar7 != (char *)0x0) {
      pcVar8 = pcVar7;
    }
    printf("\tid : %s\n",pcVar8);
    printf("\tinit_value : %p\n",(node->node).declaration.init_value);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((node->node).declaration.lx_srcpos);
    putchar(10);
    printf("\tis_subroutine : %d\n",(ulong)(uint)(node->node).declaration.is_subroutine);
    printf("\tvaridiac_subroutine_param_count : %d\n",
           (ulong)(uint)(node->node).declaration.varidiac_subroutine_param_count);
    printf("\tis_typedef : %d\n",(ulong)(uint)(node->node).declaration.is_typedef);
    printf("\taddr_taken : %d\n",(ulong)(uint)(node->node).declaration.addr_taken);
    printf("\tis_extern : %d\n",(ulong)(uint)(node->node).declaration.is_extern);
    printf("\tparams : ");
    for (plVar3 = (node->node).declaration.params; plVar3 != (sm_list)0x0; plVar3 = plVar3->next) {
      printf(" %p",plVar3->node);
    }
    putchar(10);
    printf("\tcg_oprnd : %d\n",(ulong)(uint)(node->node).declaration.cg_oprnd);
    printf("\tcg_type : %d\n",(ulong)(uint)(node->node).declaration.cg_type);
    printf("\tclosure_id : %p\n",(node->node).declaration.closure_id);
    psVar6 = (sm_ref)(node->node).declaration.cg_address;
    pcVar7 = "\tcg_address : %p\n";
    break;
  case cod_label_statement:
    printf("0x%p  --  label_statement ->\n",node);
    plVar3 = (node->node).compound_statement.decls;
    plVar5 = (sm_list)"<NULL>";
    if (plVar3 != (sm_list)0x0) {
      plVar5 = plVar3;
    }
    printf("\tname : %s\n",plVar5);
    printf("\tcg_label : %d\n",(ulong)(uint)(node->node).label_statement.cg_label);
    psVar6 = (node->node).declaration.freeable_complex_type;
    pcVar7 = "\tstatement : %p\n";
    break;
  case cod_return_statement:
    printf("0x%p  --  return_statement ->\n",node);
    printf("\texpression : %p\n",(node->node).compound_statement.decls);
    printf("\tcg_func_type : %d\n",(ulong)(uint)(node->node).label_statement.cg_label);
    printf("\tlx_srcpos : ");
    pos = (node->node).return_statement.lx_srcpos;
    goto LAB_0013805c;
  case cod_jump_statement:
    printf("0x%p  --  jump_statement ->\n",node);
    printf("\tcontinue_flag : %d\n",(ulong)(node->node).operator.op);
    plVar3 = (node->node).compound_statement.statements;
    plVar5 = (sm_list)"<NULL>";
    if (plVar3 != (sm_list)0x0) {
      plVar5 = plVar3;
    }
    printf("\tgoto_target : %s\n",plVar5);
    pcVar7 = (char *)(node->node).declaration.freeable_complex_type;
    pcVar8 = "\tsm_target_stmt : %p\n";
    goto LAB_00137eca;
  case cod_selection_statement:
    printf("0x%p  --  selection_statement ->\n",node);
    printf("\tconditional : %p\n",(node->node).compound_statement.decls);
    printf("\tthen_part : %p\n",(node->node).compound_statement.statements);
    pcVar7 = (char *)(node->node).declaration.freeable_complex_type;
    pcVar8 = "\telse_part : %p\n";
    goto LAB_00137eca;
  case cod_iteration_statement:
    printf("0x%p  --  iteration_statement ->\n",node);
    printf("\tinit_expr : %p\n",(node->node).compound_statement.decls);
    printf("\ttest_expr : %p\n",(node->node).compound_statement.statements);
    printf("\tpost_test_expr : %p\n",(node->node).declaration.freeable_complex_type);
    printf("\titer_expr : %p\n",(node->node).iteration_statement.iter_expr);
    printf("\tstatement : %p\n",(node->node).iteration_statement.statement);
    printf("\tcg_iter_label : %d\n",(ulong)(uint)(node->node).iteration_statement.cg_iter_label);
    printf("\tcg_end_label : %d\n",(ulong)(uint)(node->node).iteration_statement.cg_end_label);
    printf("\tlx_srcpos : ");
    pos = (node->node).iteration_statement.lx_srcpos;
    goto LAB_0013805c;
  case cod_expression_statement:
    printf("0x%p  --  expression_statement ->\n",node);
    psVar6 = (sm_ref)(node->node).compound_statement.decls;
    goto LAB_00138285;
  case cod_assignment_expression:
    printf("0x%p  --  assignment_expression ->\n",node);
    printf("\tleft : %p\n",(node->node).compound_statement.decls);
    printf("\tright : %p\n",(node->node).compound_statement.statements);
    printf("\tlx_srcpos : ");
    cod_print_srcpos(*(srcpos *)&(node->node).return_statement.lx_srcpos.character);
    putchar(10);
    printf("\top : ");
    cod_print_operator_t((node->node).assignment_expression.op);
    putchar(10);
    uVar4 = (ulong)(uint)(node->node).declaration.const_var;
    goto LAB_00137e7e;
  case cod_comma_expression:
    printf("0x%p  --  comma_expression ->\n",node);
    printf("\tleft : %p\n",(node->node).compound_statement.decls);
    printf("\tright : %p\n",(node->node).compound_statement.statements);
    printf("\tlx_srcpos : ");
    pos = *(srcpos *)&(node->node).return_statement.lx_srcpos.character;
    goto LAB_0013805c;
  case cod_operator:
    printf("0x%p  --  operator ->\n",node);
    printf("\top : ");
    cod_print_operator_t((node->node).operator.op);
    putchar(10);
    printf("\tleft : %p\n",(node->node).compound_statement.statements);
    printf("\tright : %p\n",(node->node).declaration.freeable_complex_type);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((node->node).jump_statement.lx_srcpos);
    putchar(10);
    printf("\toperation_type : %d\n",(ulong)(uint)(node->node).declaration.param_num);
    uVar1 = (node->node).operator.result_type;
    goto LAB_00137706;
  case cod_conditional_operator:
    printf("0x%p  --  conditional_operator ->\n",node);
    printf("\tcondition : %p\n",(node->node).compound_statement.decls);
    printf("\te1 : %p\n",(node->node).compound_statement.statements);
    printf("\te2 : %p\n",(node->node).declaration.freeable_complex_type);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((node->node).jump_statement.lx_srcpos);
    putchar(10);
    uVar1 = (node->node).declaration.param_num;
LAB_00137706:
    uVar4 = (ulong)uVar1;
    pcVar7 = "\tresult_type : %d\n";
    goto LAB_001381eb;
  case cod_identifier:
    printf("0x%p  --  identifier ->\n",node);
    plVar3 = (node->node).compound_statement.decls;
    plVar5 = (sm_list)"<NULL>";
    if (plVar3 != (sm_list)0x0) {
      plVar5 = plVar3;
    }
    printf("\tid : %s\n",plVar5);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((node->node).identifier.lx_srcpos);
    putchar(10);
    printf("\tsm_declaration : %p\n",(node->node).declaration.freeable_complex_type);
    uVar4 = (ulong)(node->node).assignment_expression.op;
    goto LAB_00137e7e;
  case cod_constant:
    printf("0x%p  --  constant ->\n",node);
    printf("\ttoken : %d\n",(ulong)(node->node).operator.op);
    pcVar7 = (char *)(node->node).compound_statement.statements;
    if ((sm_list)pcVar7 == (sm_list)0x0) {
      pcVar7 = "<NULL>";
    }
    printf("\tconst_val : %s\n",pcVar7);
    pcVar7 = (char *)(node->node).declaration.freeable_complex_type;
    if ((sm_ref)pcVar7 == (sm_ref)0x0) {
      pcVar7 = "<NULL>";
    }
    pcVar8 = "\tfreeable_name : %s\n";
LAB_00137eca:
    printf(pcVar8,pcVar7);
    printf("\tlx_srcpos : ");
    pos = (node->node).jump_statement.lx_srcpos;
LAB_0013805c:
    cod_print_srcpos(pos);
    goto LAB_00138061;
  case cod_type_specifier:
    printf("0x%p  --  type_specifier ->\n",node);
    printf("\ttoken : %d\n",(ulong)(node->node).operator.op);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((node->node).type_specifier.lx_srcpos);
    putchar(10);
    psVar6 = (node->node).declaration.freeable_complex_type;
    pcVar7 = "\tcreated_type_decl : %p\n";
    break;
  case cod_struct_type_decl:
    printf("0x%p  --  struct_type_decl ->\n",node);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((node->node).struct_type_decl.lx_srcpos);
    putchar(10);
    plVar3 = (node->node).compound_statement.statements;
    plVar5 = (sm_list)"<NULL>";
    if (plVar3 != (sm_list)0x0) {
      plVar5 = plVar3;
    }
    printf("\tid : %s\n",plVar5);
    printf("\tfields : ");
    for (plVar3 = (node->node).struct_type_decl.fields; plVar3 != (sm_list)0x0;
        plVar3 = plVar3->next) {
      printf(" %p",plVar3->node);
    }
    putchar(10);
    printf("\tcg_size : %d\n",(ulong)(node->node).assignment_expression.op);
    printf("\tencode_info : ");
    cod_print_enc_info((node->node).struct_type_decl.encode_info);
    goto LAB_00138061;
  case cod_enum_type_decl:
    printf("0x%p  --  enum_type_decl ->\n",node);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((node->node).struct_type_decl.lx_srcpos);
    putchar(10);
    plVar3 = (node->node).compound_statement.statements;
    plVar5 = (sm_list)"<NULL>";
    if (plVar3 != (sm_list)0x0) {
      plVar5 = plVar3;
    }
    printf("\tid : %s\n",plVar5);
    printf("\tenums : ");
    for (plVar3 = (node->node).struct_type_decl.fields; plVar3 != (sm_list)0x0;
        plVar3 = plVar3->next) {
      printf(" %p",plVar3->node);
    }
    goto LAB_00138061;
  case cod_array_type_decl:
    printf("0x%p  --  array_type_decl ->\n",node);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((node->node).struct_type_decl.lx_srcpos);
    putchar(10);
    printf("\tsize_expr : %p\n",(node->node).compound_statement.statements);
    printf("\telement_ref : %p\n",(node->node).declaration.freeable_complex_type);
    printf("\tstatic_var : %d\n",(ulong)(node->node).assignment_expression.op);
    printf("\ttype_spec : ");
    for (plVar3 = (node->node).array_type_decl.type_spec; plVar3 != (sm_list)0x0;
        plVar3 = plVar3->next) {
      printf(" %p",plVar3->node);
    }
    putchar(10);
    printf("\tdimensions : ");
    cod_print_dimen_p((node->node).array_type_decl.dimensions);
    putchar(10);
    printf("\tcg_static_size : %d\n",(ulong)(uint)(node->node).iteration_statement.lx_srcpos.line);
    printf("\tsm_dynamic_size : %p\n",(node->node).array_type_decl.sm_dynamic_size);
    printf("\tcg_element_type : %d\n",(ulong)(uint)(node->node).declaration.is_subroutine);
    printf("\tsm_complex_element_type : %p\n",(node->node).array_type_decl.sm_complex_element_type);
    printf("\tfreeable_complex_element_type : %p\n",
           (node->node).array_type_decl.freeable_complex_element_type);
    uVar4 = (ulong)(uint)(node->node).array_type_decl.cg_element_size;
    pcVar7 = "\tcg_element_size : %d\n";
    goto LAB_001381eb;
  case cod_reference_type_decl:
    printf("0x%p  --  reference_type_decl ->\n",node);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((node->node).struct_type_decl.lx_srcpos);
    putchar(10);
    plVar3 = (node->node).compound_statement.statements;
    plVar5 = (sm_list)"<NULL>";
    if (plVar3 != (sm_list)0x0) {
      plVar5 = plVar3;
    }
    printf("\tname : %s\n",plVar5);
    printf("\ttype_spec : ");
    for (plVar3 = (node->node).struct_type_decl.fields; plVar3 != (sm_list)0x0;
        plVar3 = plVar3->next) {
      printf(" %p",plVar3->node);
    }
    putchar(10);
    printf("\tcg_referenced_type : %d\n",(ulong)(node->node).assignment_expression.op);
    printf("\tsm_complex_referenced_type : %p\n",(node->node).iteration_statement.statement);
    printf("\tfreeable_complex_referenced_type : %p\n",(node->node).declaration.id);
    printf("\tcg_referenced_size : %d\n",
           (ulong)(uint)(node->node).iteration_statement.lx_srcpos.line);
    uVar4 = (ulong)(uint)(node->node).iteration_statement.lx_srcpos.character;
    pcVar7 = "\tkernel_ref : %d\n";
    goto LAB_001381eb;
  case cod_field:
    printf("0x%p  --  field ->\n",node);
    pcVar7 = (char *)(node->node).compound_statement.decls;
    if ((sm_list)pcVar7 == (sm_list)0x0) {
      pcVar7 = "<NULL>";
    }
    printf("\tname : %s\n",pcVar7);
    pcVar7 = (char *)(node->node).compound_statement.statements;
    if ((sm_list)pcVar7 == (sm_list)0x0) {
      pcVar7 = "<NULL>";
    }
    printf("\tstring_type : %s\n",pcVar7);
    printf("\ttype_spec : ");
    for (plVar3 = (node->node).struct_type_decl.fields; plVar3 != (sm_list)0x0;
        plVar3 = plVar3->next) {
      printf(" %p",plVar3->node);
    }
    putchar(10);
    printf("\tsm_complex_type : %p\n",(node->node).iteration_statement.iter_expr);
    printf("\tfreeable_complex_type : %p\n",(node->node).iteration_statement.statement);
    printf("\tcg_size : %d\n",(ulong)(uint)(node->node).iteration_statement.cg_iter_label);
    printf("\tcg_offset : %d\n",(ulong)(uint)(node->node).iteration_statement.cg_end_label);
    uVar4 = (ulong)(uint)(node->node).iteration_statement.lx_srcpos.line;
LAB_00137e7e:
    pcVar7 = "\tcg_type : %d\n";
LAB_001381eb:
    printf(pcVar7,uVar4);
    goto LAB_001382fd;
  case cod_field_ref:
    printf("0x%p  --  field_ref ->\n",node);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((node->node).struct_type_decl.lx_srcpos);
    putchar(10);
    printf("\tstruct_ref : %p\n",(node->node).compound_statement.statements);
    psVar2 = (node->node).declaration.freeable_complex_type;
    psVar6 = (sm_ref)"<NULL>";
    if (psVar2 != (sm_ref)0x0) {
      psVar6 = psVar2;
    }
    printf("\tlx_field : %s\n",psVar6);
    psVar6 = (node->node).iteration_statement.iter_expr;
    pcVar7 = "\tsm_field_ref : %p\n";
    break;
  case cod_subroutine_call:
    printf("0x%p  --  subroutine_call ->\n",node);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((node->node).struct_type_decl.lx_srcpos);
    putchar(10);
    printf("\tsm_func_ref : %p\n",(node->node).compound_statement.statements);
    printf("\targuments : ");
    for (plVar3 = (node->node).struct_type_decl.fields; plVar3 != (sm_list)0x0;
        plVar3 = plVar3->next) {
      printf(" %p",plVar3->node);
    }
    goto LAB_00138061;
  case cod_element_ref:
    printf("0x%p  --  element_ref ->\n",node);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((node->node).struct_type_decl.lx_srcpos);
    putchar(10);
    printf("\tarray_ref : %p\n",(node->node).compound_statement.statements);
    printf("\tsm_complex_element_type : %p\n",(node->node).declaration.freeable_complex_type);
    printf("\tsm_containing_structure_ref : %p\n",(node->node).iteration_statement.iter_expr);
    printf("\tcg_element_type : %d\n",(ulong)(uint)(node->node).declaration.param_num);
    printf("\tthis_index_dimension : %d\n",(ulong)(uint)(node->node).operator.result_type);
    psVar6 = (sm_ref)(node->node).declaration.id;
LAB_00138285:
    pcVar7 = "\texpression : %p\n";
    break;
  case cod_cast:
    printf("0x%p  --  cast ->\n",node);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((node->node).struct_type_decl.lx_srcpos);
    putchar(10);
    printf("\ttype_spec : ");
    for (plVar3 = (node->node).compound_statement.statements; plVar3 != (sm_list)0x0;
        plVar3 = plVar3->next) {
      printf(" %p",plVar3->node);
    }
    putchar(10);
    printf("\tcg_type : %d\n",(ulong)(uint)(node->node).enumerator.enum_value);
    printf("\texpression : %p\n",(node->node).iteration_statement.iter_expr);
    psVar6 = (node->node).iteration_statement.statement;
    pcVar7 = "\tsm_complex_type : %p\n";
    break;
  case cod_initializer_list:
    printf("0x%p  --  initializer_list ->\n",node);
    printf("\tinitializers : ");
    for (plVar3 = (node->node).compound_statement.decls; plVar3 != (sm_list)0x0;
        plVar3 = plVar3->next) {
      printf(" %p",plVar3->node);
    }
LAB_00138061:
    putchar(10);
    goto LAB_001382fd;
  case cod_initializer:
    printf("0x%p  --  initializer ->\n",node);
    printf("\tdesignation : ");
    for (plVar3 = (node->node).compound_statement.decls; plVar3 != (sm_list)0x0;
        plVar3 = plVar3->next) {
      printf(" %p",plVar3->node);
    }
    putchar(10);
    psVar6 = (sm_ref)(node->node).compound_statement.statements;
    pcVar7 = "\tinitializer : %p\n";
    break;
  case cod_designator:
    printf("0x%p  --  designator ->\n",node);
    printf("\texpression : %p\n",(node->node).compound_statement.decls);
    psVar2 = (sm_ref)(node->node).compound_statement.statements;
    psVar6 = (sm_ref)"<NULL>";
    if (psVar2 != (sm_ref)0x0) {
      psVar6 = psVar2;
    }
    pcVar7 = "\tid : %s\n";
    break;
  default:
    puts("Unhandled case in cod_print");
    goto LAB_001382fd;
  }
  printf(pcVar7,psVar6);
LAB_001382fd:
  putchar(10);
  return;
}

Assistant:

extern void cod_print(sm_ref node)
{
    switch(node->node_type) {
      case cod_compound_statement: {
          printf("0x%p  --  compound_statement ->\n", node);
          printf("	decls : ");
          cod_print_sm_list(node->node.compound_statement.decls);
          printf("\n");
          printf("	statements : ");
          cod_print_sm_list(node->node.compound_statement.statements);
          printf("\n");
          break;
      }
      case cod_enumerator: {
          printf("0x%p  --  enumerator ->\n", node);
          printf("	id : %s\n", (node->node.enumerator.id == NULL) ? "<NULL>" : node->node.enumerator.id);
          printf("	const_expression : %p\n", node->node.enumerator.const_expression);
          printf("	enum_value : %d\n", node->node.enumerator.enum_value);
          break;
      }
      case cod_declaration: {
          printf("0x%p  --  declaration ->\n", node);
          printf("	type_spec : ");
          cod_print_sm_list(node->node.declaration.type_spec);
          printf("\n");
          printf("	sm_complex_type : %p\n", node->node.declaration.sm_complex_type);
          printf("	freeable_complex_type : %p\n", node->node.declaration.freeable_complex_type);
          printf("	static_var : %d\n", node->node.declaration.static_var);
          printf("	const_var : %d\n", node->node.declaration.const_var);
          printf("	param_num : %d\n", node->node.declaration.param_num);
          printf("	id : %s\n", (node->node.declaration.id == NULL) ? "<NULL>" : node->node.declaration.id);
          printf("	init_value : %p\n", node->node.declaration.init_value);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.declaration.lx_srcpos);
          printf("\n");
          printf("	is_subroutine : %d\n", node->node.declaration.is_subroutine);
          printf("	varidiac_subroutine_param_count : %d\n", node->node.declaration.varidiac_subroutine_param_count);
          printf("	is_typedef : %d\n", node->node.declaration.is_typedef);
          printf("	addr_taken : %d\n", node->node.declaration.addr_taken);
          printf("	is_extern : %d\n", node->node.declaration.is_extern);
          printf("	params : ");
          cod_print_sm_list(node->node.declaration.params);
          printf("\n");
          printf("	cg_oprnd : %d\n", node->node.declaration.cg_oprnd);
          printf("	cg_type : %d\n", node->node.declaration.cg_type);
          printf("	closure_id : %p\n", node->node.declaration.closure_id);
          printf("	cg_address : %p\n", node->node.declaration.cg_address);
          break;
      }
      case cod_label_statement: {
          printf("0x%p  --  label_statement ->\n", node);
          printf("	name : %s\n", (node->node.label_statement.name == NULL) ? "<NULL>" : node->node.label_statement.name);
          printf("	cg_label : %d\n", node->node.label_statement.cg_label);
          printf("	statement : %p\n", node->node.label_statement.statement);
          break;
      }
      case cod_return_statement: {
          printf("0x%p  --  return_statement ->\n", node);
          printf("	expression : %p\n", node->node.return_statement.expression);
          printf("	cg_func_type : %d\n", node->node.return_statement.cg_func_type);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.return_statement.lx_srcpos);
          printf("\n");
          break;
      }
      case cod_jump_statement: {
          printf("0x%p  --  jump_statement ->\n", node);
          printf("	continue_flag : %d\n", node->node.jump_statement.continue_flag);
          printf("	goto_target : %s\n", (node->node.jump_statement.goto_target == NULL) ? "<NULL>" : node->node.jump_statement.goto_target);
          printf("	sm_target_stmt : %p\n", node->node.jump_statement.sm_target_stmt);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.jump_statement.lx_srcpos);
          printf("\n");
          break;
      }
      case cod_selection_statement: {
          printf("0x%p  --  selection_statement ->\n", node);
          printf("	conditional : %p\n", node->node.selection_statement.conditional);
          printf("	then_part : %p\n", node->node.selection_statement.then_part);
          printf("	else_part : %p\n", node->node.selection_statement.else_part);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.selection_statement.lx_srcpos);
          printf("\n");
          break;
      }
      case cod_iteration_statement: {
          printf("0x%p  --  iteration_statement ->\n", node);
          printf("	init_expr : %p\n", node->node.iteration_statement.init_expr);
          printf("	test_expr : %p\n", node->node.iteration_statement.test_expr);
          printf("	post_test_expr : %p\n", node->node.iteration_statement.post_test_expr);
          printf("	iter_expr : %p\n", node->node.iteration_statement.iter_expr);
          printf("	statement : %p\n", node->node.iteration_statement.statement);
          printf("	cg_iter_label : %d\n", node->node.iteration_statement.cg_iter_label);
          printf("	cg_end_label : %d\n", node->node.iteration_statement.cg_end_label);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.iteration_statement.lx_srcpos);
          printf("\n");
          break;
      }
      case cod_expression_statement: {
          printf("0x%p  --  expression_statement ->\n", node);
          printf("	expression : %p\n", node->node.expression_statement.expression);
          break;
      }
      case cod_assignment_expression: {
          printf("0x%p  --  assignment_expression ->\n", node);
          printf("	left : %p\n", node->node.assignment_expression.left);
          printf("	right : %p\n", node->node.assignment_expression.right);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.assignment_expression.lx_srcpos);
          printf("\n");
          printf("	op : ");
          cod_print_operator_t(node->node.assignment_expression.op);
          printf("\n");
          printf("	cg_type : %d\n", node->node.assignment_expression.cg_type);
          break;
      }
      case cod_comma_expression: {
          printf("0x%p  --  comma_expression ->\n", node);
          printf("	left : %p\n", node->node.comma_expression.left);
          printf("	right : %p\n", node->node.comma_expression.right);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.comma_expression.lx_srcpos);
          printf("\n");
          break;
      }
      case cod_operator: {
          printf("0x%p  --  operator ->\n", node);
          printf("	op : ");
          cod_print_operator_t(node->node.operator.op);
          printf("\n");
          printf("	left : %p\n", node->node.operator.left);
          printf("	right : %p\n", node->node.operator.right);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.operator.lx_srcpos);
          printf("\n");
          printf("	operation_type : %d\n", node->node.operator.operation_type);
          printf("	result_type : %d\n", node->node.operator.result_type);
          break;
      }
      case cod_conditional_operator: {
          printf("0x%p  --  conditional_operator ->\n", node);
          printf("	condition : %p\n", node->node.conditional_operator.condition);
          printf("	e1 : %p\n", node->node.conditional_operator.e1);
          printf("	e2 : %p\n", node->node.conditional_operator.e2);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.conditional_operator.lx_srcpos);
          printf("\n");
          printf("	result_type : %d\n", node->node.conditional_operator.result_type);
          break;
      }
      case cod_identifier: {
          printf("0x%p  --  identifier ->\n", node);
          printf("	id : %s\n", (node->node.identifier.id == NULL) ? "<NULL>" : node->node.identifier.id);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.identifier.lx_srcpos);
          printf("\n");
          printf("	sm_declaration : %p\n", node->node.identifier.sm_declaration);
          printf("	cg_type : %d\n", node->node.identifier.cg_type);
          break;
      }
      case cod_constant: {
          printf("0x%p  --  constant ->\n", node);
          printf("	token : %d\n", node->node.constant.token);
          printf("	const_val : %s\n", (node->node.constant.const_val == NULL) ? "<NULL>" : node->node.constant.const_val);
          printf("	freeable_name : %s\n", (node->node.constant.freeable_name == NULL) ? "<NULL>" : node->node.constant.freeable_name);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.constant.lx_srcpos);
          printf("\n");
          break;
      }
      case cod_type_specifier: {
          printf("0x%p  --  type_specifier ->\n", node);
          printf("	token : %d\n", node->node.type_specifier.token);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.type_specifier.lx_srcpos);
          printf("\n");
          printf("	created_type_decl : %p\n", node->node.type_specifier.created_type_decl);
          break;
      }
      case cod_struct_type_decl: {
          printf("0x%p  --  struct_type_decl ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.struct_type_decl.lx_srcpos);
          printf("\n");
          printf("	id : %s\n", (node->node.struct_type_decl.id == NULL) ? "<NULL>" : node->node.struct_type_decl.id);
          printf("	fields : ");
          cod_print_sm_list(node->node.struct_type_decl.fields);
          printf("\n");
          printf("	cg_size : %d\n", node->node.struct_type_decl.cg_size);
          printf("	encode_info : ");
          cod_print_enc_info(node->node.struct_type_decl.encode_info);
          printf("\n");
          break;
      }
      case cod_enum_type_decl: {
          printf("0x%p  --  enum_type_decl ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.enum_type_decl.lx_srcpos);
          printf("\n");
          printf("	id : %s\n", (node->node.enum_type_decl.id == NULL) ? "<NULL>" : node->node.enum_type_decl.id);
          printf("	enums : ");
          cod_print_sm_list(node->node.enum_type_decl.enums);
          printf("\n");
          break;
      }
      case cod_array_type_decl: {
          printf("0x%p  --  array_type_decl ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.array_type_decl.lx_srcpos);
          printf("\n");
          printf("	size_expr : %p\n", node->node.array_type_decl.size_expr);
          printf("	element_ref : %p\n", node->node.array_type_decl.element_ref);
          printf("	static_var : %d\n", node->node.array_type_decl.static_var);
          printf("	type_spec : ");
          cod_print_sm_list(node->node.array_type_decl.type_spec);
          printf("\n");
          printf("	dimensions : ");
          cod_print_dimen_p(node->node.array_type_decl.dimensions);
          printf("\n");
          printf("	cg_static_size : %d\n", node->node.array_type_decl.cg_static_size);
          printf("	sm_dynamic_size : %p\n", node->node.array_type_decl.sm_dynamic_size);
          printf("	cg_element_type : %d\n", node->node.array_type_decl.cg_element_type);
          printf("	sm_complex_element_type : %p\n", node->node.array_type_decl.sm_complex_element_type);
          printf("	freeable_complex_element_type : %p\n", node->node.array_type_decl.freeable_complex_element_type);
          printf("	cg_element_size : %d\n", node->node.array_type_decl.cg_element_size);
          break;
      }
      case cod_reference_type_decl: {
          printf("0x%p  --  reference_type_decl ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.reference_type_decl.lx_srcpos);
          printf("\n");
          printf("	name : %s\n", (node->node.reference_type_decl.name == NULL) ? "<NULL>" : node->node.reference_type_decl.name);
          printf("	type_spec : ");
          cod_print_sm_list(node->node.reference_type_decl.type_spec);
          printf("\n");
          printf("	cg_referenced_type : %d\n", node->node.reference_type_decl.cg_referenced_type);
          printf("	sm_complex_referenced_type : %p\n", node->node.reference_type_decl.sm_complex_referenced_type);
          printf("	freeable_complex_referenced_type : %p\n", node->node.reference_type_decl.freeable_complex_referenced_type);
          printf("	cg_referenced_size : %d\n", node->node.reference_type_decl.cg_referenced_size);
          printf("	kernel_ref : %d\n", node->node.reference_type_decl.kernel_ref);
          break;
      }
      case cod_field: {
          printf("0x%p  --  field ->\n", node);
          printf("	name : %s\n", (node->node.field.name == NULL) ? "<NULL>" : node->node.field.name);
          printf("	string_type : %s\n", (node->node.field.string_type == NULL) ? "<NULL>" : node->node.field.string_type);
          printf("	type_spec : ");
          cod_print_sm_list(node->node.field.type_spec);
          printf("\n");
          printf("	sm_complex_type : %p\n", node->node.field.sm_complex_type);
          printf("	freeable_complex_type : %p\n", node->node.field.freeable_complex_type);
          printf("	cg_size : %d\n", node->node.field.cg_size);
          printf("	cg_offset : %d\n", node->node.field.cg_offset);
          printf("	cg_type : %d\n", node->node.field.cg_type);
          break;
      }
      case cod_field_ref: {
          printf("0x%p  --  field_ref ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.field_ref.lx_srcpos);
          printf("\n");
          printf("	struct_ref : %p\n", node->node.field_ref.struct_ref);
          printf("	lx_field : %s\n", (node->node.field_ref.lx_field == NULL) ? "<NULL>" : node->node.field_ref.lx_field);
          printf("	sm_field_ref : %p\n", node->node.field_ref.sm_field_ref);
          break;
      }
      case cod_subroutine_call: {
          printf("0x%p  --  subroutine_call ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.subroutine_call.lx_srcpos);
          printf("\n");
          printf("	sm_func_ref : %p\n", node->node.subroutine_call.sm_func_ref);
          printf("	arguments : ");
          cod_print_sm_list(node->node.subroutine_call.arguments);
          printf("\n");
          break;
      }
      case cod_element_ref: {
          printf("0x%p  --  element_ref ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.element_ref.lx_srcpos);
          printf("\n");
          printf("	array_ref : %p\n", node->node.element_ref.array_ref);
          printf("	sm_complex_element_type : %p\n", node->node.element_ref.sm_complex_element_type);
          printf("	sm_containing_structure_ref : %p\n", node->node.element_ref.sm_containing_structure_ref);
          printf("	cg_element_type : %d\n", node->node.element_ref.cg_element_type);
          printf("	this_index_dimension : %d\n", node->node.element_ref.this_index_dimension);
          printf("	expression : %p\n", node->node.element_ref.expression);
          break;
      }
      case cod_cast: {
          printf("0x%p  --  cast ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.cast.lx_srcpos);
          printf("\n");
          printf("	type_spec : ");
          cod_print_sm_list(node->node.cast.type_spec);
          printf("\n");
          printf("	cg_type : %d\n", node->node.cast.cg_type);
          printf("	expression : %p\n", node->node.cast.expression);
          printf("	sm_complex_type : %p\n", node->node.cast.sm_complex_type);
          break;
      }
      case cod_initializer_list: {
          printf("0x%p  --  initializer_list ->\n", node);
          printf("	initializers : ");
          cod_print_sm_list(node->node.initializer_list.initializers);
          printf("\n");
          break;
      }
      case cod_initializer: {
          printf("0x%p  --  initializer ->\n", node);
          printf("	designation : ");
          cod_print_sm_list(node->node.initializer.designation);
          printf("\n");
          printf("	initializer : %p\n", node->node.initializer.initializer);
          break;
      }
      case cod_designator: {
          printf("0x%p  --  designator ->\n", node);
          printf("	expression : %p\n", node->node.designator.expression);
          printf("	id : %s\n", (node->node.designator.id == NULL) ? "<NULL>" : node->node.designator.id);
          break;
      }
      default: printf("Unhandled case in cod_print\n");
    }
    printf("\n");
}